

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O3

size_t ZSTD_freeCCtx(ZSTD_CCtx *cctx)

{
  size_t sVar1;
  
  if (cctx == (ZSTD_CCtx *)0x0) {
    sVar1 = 0;
  }
  else {
    sVar1 = 0xffffffffffffffc0;
    if (cctx->staticSize == 0) {
      ZSTD_free(cctx->workSpace,cctx->customMem);
      sVar1 = 0;
      cctx->workSpace = (void *)0x0;
      ZSTD_freeCDict(cctx->cdictLocal);
      cctx->cdictLocal = (ZSTD_CDict *)0x0;
      ZSTD_free(cctx,cctx->customMem);
    }
  }
  return sVar1;
}

Assistant:

size_t ZSTD_freeCCtx(ZSTD_CCtx* cctx)
{
    if (cctx==NULL) return 0;   /* support free on NULL */
    if (cctx->staticSize) return ERROR(memory_allocation);   /* not compatible with static CCtx */
    ZSTD_freeCCtxContent(cctx);
    ZSTD_free(cctx, cctx->customMem);
    return 0;
}